

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

int bit_tohex(lua_State *L)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  lua_Integer lVar4;
  char *pcVar5;
  size_t len;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  char buf [8];
  char acStack_18 [8];
  
  uVar3 = luaL_checkinteger(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 == -1) {
    uVar2 = 8;
    pcVar5 = "0123456789abcdef";
  }
  else {
    lVar4 = luaL_checkinteger(L,2);
    pcVar5 = "0123456789abcdef";
    uVar2 = (uint)lVar4;
    if ((int)uVar2 < 0) {
      pcVar5 = "0123456789ABCDEF";
    }
    if (uVar2 == 0) {
      uVar2 = 0;
      goto LAB_001536ef;
    }
  }
  uVar8 = -uVar2;
  if (0 < (int)uVar2) {
    uVar8 = uVar2;
  }
  uVar6 = 8;
  if ((int)uVar8 < 8) {
    uVar6 = uVar8;
  }
  iVar1 = uVar6 + 1;
  pcVar7 = acStack_18 + (uVar6 - 1);
  do {
    uVar8 = (uint)uVar3;
    uVar3 = (ulong)(uVar8 >> 4);
    iVar1 = iVar1 + -1;
    *pcVar7 = pcVar5[uVar8 & 0xf];
    pcVar7 = pcVar7 + -1;
  } while (1 < iVar1);
LAB_001536ef:
  uVar8 = -uVar2;
  if (0 < (int)uVar2) {
    uVar8 = uVar2;
  }
  len = 8;
  if (uVar8 < 8) {
    len = (size_t)uVar8;
  }
  lua_pushlstring(L,acStack_18,len);
  return 1;
}

Assistant:

static int bit_tohex(lua_State *L)
{
  UBits b = barg(L, 1);
  SBits n = lua_isnone(L, 2) ? 8 : (SBits)barg(L, 2);
  const char *hexdigits = "0123456789abcdef";
  char buf[8];
  int i;
  if (n < 0) { n = -n; hexdigits = "0123456789ABCDEF"; }
  if (n > 8) n = 8;
  for (i = (int)n; --i >= 0; ) { buf[i] = hexdigits[b & 15]; b >>= 4; }
  lua_pushlstring(L, buf, (size_t)n);
  return 1;
}